

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O2

void vrna_exp_params_subst(vrna_fold_compound_t *vc,vrna_exp_param_t *params)

{
  vrna_exp_param_t *pvVar1;
  
  if (vc == (vrna_fold_compound_t *)0x0) {
    return;
  }
  free(vc->exp_params);
  if (params == (vrna_exp_param_t *)0x0) {
    if (vc->type != VRNA_FC_TYPE_COMPARATIVE) {
      if (vc->type == VRNA_FC_TYPE_SINGLE) {
        pvVar1 = vrna_exp_params((vrna_md_t *)0x0);
        vc->exp_params = pvVar1;
        if (1 < vc->strands) {
          (pvVar1->model_details).min_loop_size = 0;
        }
      }
      goto LAB_0011e337;
    }
    pvVar1 = vrna_exp_params_comparative((vc->field_23).field_1.n_seq,(vrna_md_t *)0x0);
  }
  else {
    pvVar1 = vrna_exp_params_copy(params);
  }
  vc->exp_params = pvVar1;
LAB_0011e337:
  vrna_exp_params_rescale(vc,(double *)0x0);
  return;
}

Assistant:

PUBLIC void
vrna_exp_params_subst(vrna_fold_compound_t  *vc,
                      vrna_exp_param_t      *params)
{
  if (vc) {
    if (vc->exp_params)
      free(vc->exp_params);

    if (params) {
      vc->exp_params = vrna_exp_params_copy(params);
    } else {
      switch (vc->type) {
        case VRNA_FC_TYPE_SINGLE:
          vc->exp_params = vrna_exp_params(NULL);
          if (vc->strands > 1)
            vc->exp_params->model_details.min_loop_size = 0;

          break;

        case VRNA_FC_TYPE_COMPARATIVE:
          vc->exp_params = vrna_exp_params_comparative(vc->n_seq, NULL);
          break;

        default:
          break;
      }
    }

    /* fill additional helper arrays for scaling etc. */
    vrna_exp_params_rescale(vc, NULL);
  }
}